

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_mesh_shading.cpp
# Opt level: O1

spv_result_t spvtools::val::MeshShadingPass(ValidationState_t *_,Instruction *inst)

{
  size_t *psVar1;
  uint16_t uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint32_t uVar7;
  spv_result_t id;
  uint id_00;
  StorageClass SVar8;
  Function *pFVar9;
  _Node *p_Var10;
  Instruction *this;
  undefined7 extraout_var;
  long lVar11;
  byte bVar12;
  ulong uVar13;
  char *pcVar14;
  string local_268;
  _Any_data local_248;
  code *local_238;
  code *local_230;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  DiagnosticStream local_208;
  
  uVar2 = (inst->inst_).opcode;
  if (uVar2 == 0x3b) {
    bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityMeshShadingEXT);
    if (!bVar3) {
      return SPV_SUCCESS;
    }
    bVar4 = IsInterfaceVariable(_,inst,ExecutionModelMeshEXT);
    uVar13 = CONCAT71(extraout_var,bVar4) & 0xffffffff;
    bVar5 = IsInterfaceVariable(_,inst,ExecutionModelFragment);
    SVar8 = Instruction::GetOperandAs<spv::StorageClass>(inst,2);
    bVar6 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,DecorationPerPrimitiveEXT);
    bVar3 = true;
    id = (spv_result_t)CONCAT71(extraout_var,bVar4);
    if (bVar6) {
      if (bVar5 && SVar8 != Input) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,
                   "PerPrimitiveEXT decoration must be applied only to variables in the Input Storage Class in the Fragment Execution Model."
                   ,0x78);
      }
      else {
        bVar12 = (byte)uVar13 ^ 1 | SVar8 == Output;
        id = (spv_result_t)CONCAT71((int7)(uVar13 >> 8),bVar12);
        if (bVar12 != 0) goto joined_r0x0069ac00;
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_268,_,0x10f0,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,local_268._M_dataplus._M_p,local_268._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,
                   "PerPrimitiveEXT decoration must be applied only to variables in the Output Storage Class in the Storage Class in the MeshEXT Execution Model."
                   ,0x8d);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
      }
      DiagnosticStream::~DiagnosticStream(&local_208);
      bVar3 = false;
      id = local_208.error_;
    }
    goto joined_r0x0069ac00;
  }
  if (uVar2 == 0x14af) {
    pFVar9 = ValidationState_t::function(_,inst->function_->id_);
    local_248._M_unused._M_object = (void *)0x0;
    local_248._8_8_ = 0;
    local_230 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_mesh_shading.cpp:101:15)>
                ::_M_invoke;
    local_238 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_mesh_shading.cpp:101:15)>
                ::_M_manager;
    p_Var10 = std::__cxx11::
              list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
              ::_M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                        ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                          *)&pFVar9->execution_model_limitations_,
                         (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                          *)&local_248);
    std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
    psVar1 = &(pFVar9->execution_model_limitations_).
              super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_238 != (code *)0x0) {
      (*local_238)(&local_248,&local_248,__destroy_functor);
    }
    uVar7 = ValidationState_t::GetOperandTypeId(_,inst,0);
    bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,uVar7);
    if ((bVar3) && (uVar7 = ValidationState_t::GetBitWidth(_,uVar7), uVar7 == 0x20)) {
      id = ValidationState_t::GetOperandTypeId(_,inst,1);
      bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,id);
      if ((bVar3) && (uVar7 = ValidationState_t::GetBitWidth(_,id), uVar7 == 0x20)) {
        bVar3 = true;
        goto joined_r0x0069ac00;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar14 = "Primitive Count must be a 32-bit unsigned int scalar";
      lVar11 = 0x34;
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar14 = "Vertex Count must be a 32-bit unsigned int scalar";
      lVar11 = 0x31;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar14,lVar11);
    DiagnosticStream::~DiagnosticStream(&local_208);
    bVar3 = false;
    id = local_208.error_;
    goto joined_r0x0069ac00;
  }
  if (uVar2 != 0x14ae) {
    return SPV_SUCCESS;
  }
  pFVar9 = ValidationState_t::function(_,inst->function_->id_);
  local_228._M_unused._M_object = (void *)0x0;
  local_228._8_8_ = 0;
  local_210 = std::
              _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_mesh_shading.cpp:50:15)>
              ::_M_invoke;
  local_218 = std::
              _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_mesh_shading.cpp:50:15)>
              ::_M_manager;
  p_Var10 = std::__cxx11::
            list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
            ::_M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                      ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                        *)&pFVar9->execution_model_limitations_,
                       (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                        *)&local_228);
  std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
  psVar1 = &(pFVar9->execution_model_limitations_).
            super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_218 != (code *)0x0) {
    (*local_218)(&local_228,&local_228,__destroy_functor);
  }
  uVar7 = ValidationState_t::GetOperandTypeId(_,inst,0);
  bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,uVar7);
  if ((bVar3) && (uVar7 = ValidationState_t::GetBitWidth(_,uVar7), uVar7 == 0x20)) {
    uVar7 = ValidationState_t::GetOperandTypeId(_,inst,1);
    bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,uVar7);
    if ((!bVar3) || (uVar7 = ValidationState_t::GetBitWidth(_,uVar7), uVar7 != 0x20)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar14 = "Group Count Y must be a 32-bit unsigned int scalar";
      goto LAB_0069aafc;
    }
    id = ValidationState_t::GetOperandTypeId(_,inst,2);
    bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,id);
    if ((!bVar3) || (uVar7 = ValidationState_t::GetBitWidth(_,id), uVar7 != 0x20)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar14 = "Group Count Z must be a 32-bit unsigned int scalar";
      goto LAB_0069aafc;
    }
    bVar3 = true;
    if ((long)(inst->operands_).
              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(inst->operands_).
              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
              _M_impl.super__Vector_impl_data._M_start != 0x40) goto joined_r0x0069ac00;
    id_00 = Instruction::GetOperandAs<unsigned_int>(inst,3);
    this = ValidationState_t::FindDef(_,id_00);
    if ((this->inst_).opcode == 0x3b) {
      SVar8 = Instruction::GetOperandAs<spv::StorageClass>(this,2);
      if (SVar8 == StorageClassTaskPayloadWorkgroupEXT) goto joined_r0x0069ac00;
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar14 = "Payload OpVariable must have a storage class of TaskPayloadWorkgroupEXT";
      lVar11 = 0x47;
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar14 = "Payload must be the result of a OpVariable";
      lVar11 = 0x2a;
    }
  }
  else {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar14 = "Group Count X must be a 32-bit unsigned int scalar";
LAB_0069aafc:
    lVar11 = 0x32;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar14,lVar11);
  DiagnosticStream::~DiagnosticStream(&local_208);
  bVar3 = false;
  id = local_208.error_;
joined_r0x0069ac00:
  if (bVar3) {
    return SPV_SUCCESS;
  }
  return id;
}

Assistant:

spv_result_t MeshShadingPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  switch (opcode) {
    case spv::Op::OpEmitMeshTasksEXT: {
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::TaskEXT) {
                  if (message) {
                    *message =
                        "OpEmitMeshTasksEXT requires TaskEXT execution model";
                  }
                  return false;
                }
                return true;
              });

      const uint32_t group_count_x = _.GetOperandTypeId(inst, 0);
      if (!_.IsUnsignedIntScalarType(group_count_x) ||
          _.GetBitWidth(group_count_x) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Group Count X must be a 32-bit unsigned int scalar";
      }

      const uint32_t group_count_y = _.GetOperandTypeId(inst, 1);
      if (!_.IsUnsignedIntScalarType(group_count_y) ||
          _.GetBitWidth(group_count_y) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Group Count Y must be a 32-bit unsigned int scalar";
      }

      const uint32_t group_count_z = _.GetOperandTypeId(inst, 2);
      if (!_.IsUnsignedIntScalarType(group_count_z) ||
          _.GetBitWidth(group_count_z) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Group Count Z must be a 32-bit unsigned int scalar";
      }

      if (inst->operands().size() == 4) {
        const auto payload = _.FindDef(inst->GetOperandAs<uint32_t>(3));
        if (payload->opcode() != spv::Op::OpVariable) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Payload must be the result of a OpVariable";
        }
        if (payload->GetOperandAs<spv::StorageClass>(2) !=
            spv::StorageClass::TaskPayloadWorkgroupEXT) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Payload OpVariable must have a storage class of "
                    "TaskPayloadWorkgroupEXT";
        }
      }
      break;
    }

    case spv::Op::OpSetMeshOutputsEXT: {
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::MeshEXT) {
                  if (message) {
                    *message =
                        "OpSetMeshOutputsEXT requires MeshEXT execution model";
                  }
                  return false;
                }
                return true;
              });

      const uint32_t vertex_count = _.GetOperandTypeId(inst, 0);
      if (!_.IsUnsignedIntScalarType(vertex_count) ||
          _.GetBitWidth(vertex_count) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Vertex Count must be a 32-bit unsigned int scalar";
      }

      const uint32_t primitive_count = _.GetOperandTypeId(inst, 1);
      if (!_.IsUnsignedIntScalarType(primitive_count) ||
          _.GetBitWidth(primitive_count) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Primitive Count must be a 32-bit unsigned int scalar";
      }

      break;
    }

    case spv::Op::OpWritePackedPrimitiveIndices4x8NV: {
      // No validation rules (for the moment).
      break;
    }
    case spv::Op::OpVariable: {
      if (_.HasCapability(spv::Capability::MeshShadingEXT)) {
        bool meshInterfaceVar =
            IsInterfaceVariable(_, inst, spv::ExecutionModel::MeshEXT);
        bool fragInterfaceVar =
            IsInterfaceVariable(_, inst, spv::ExecutionModel::Fragment);

        const spv::StorageClass storage_class =
            inst->GetOperandAs<spv::StorageClass>(2);
        bool storage_output = (storage_class == spv::StorageClass::Output);
        bool storage_input = (storage_class == spv::StorageClass::Input);

        if (_.HasDecoration(inst->id(), spv::Decoration::PerPrimitiveEXT)) {
          if (fragInterfaceVar && !storage_input) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << "PerPrimitiveEXT decoration must be applied only to "
                      "variables in the Input Storage Class in the Fragment "
                      "Execution Model.";
          }

          if (meshInterfaceVar && !storage_output) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << _.VkErrorID(4336)
                   << "PerPrimitiveEXT decoration must be applied only to "
                      "variables in the Output Storage Class in the "
                      "Storage Class in the MeshEXT Execution Model.";
          }
        }
      }
      break;
    }
    default:
      break;
  }

  return SPV_SUCCESS;
}